

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

void __thiscall
JsUtil::
BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_JsUtil::CharacterBuffer<char16_t>,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_JsUtil::CharacterBuffer<char16_t>,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
         *this)

{
  Type *pTVar1;
  uint uVar2;
  undefined8 uVar3;
  int iVar4;
  uint size;
  Type TVar5;
  Type TVar6;
  hash_t hVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  undefined8 local_70;
  undefined4 local_68;
  BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_JsUtil::CharacterBuffer<char16_t>,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *local_60;
  Type *local_58;
  uint local_4c;
  Type local_48;
  int *newBuckets;
  Type local_38;
  EntryType *newEntries;
  
  uVar2 = this->count;
  size = uVar2 * 2;
  newBuckets._4_4_ = 4;
  if ((8 < size) && (uVar9 = uVar2 & 0x7fffffff, newBuckets._4_4_ = uVar9, (uVar2 - 1 & uVar9) != 0)
     ) {
    iVar4 = 0x1f;
    if (uVar9 != 0) {
      for (; uVar9 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    newBuckets._4_4_ = 2;
    if (uVar9 != 1) {
      newBuckets._4_4_ = 1 << (-((byte)iVar4 ^ 0x1f) & 0x1f);
    }
  }
  local_48.ptr = (int *)0x0;
  local_38.ptr = (SimpleHashedEntry<JsUtil::CharacterBuffer<char16_t>,_JsUtil::CharacterBuffer<char16_t>_>
                  *)0x0;
  pTVar1 = &this->entries;
  if (newBuckets._4_4_ == this->bucketCount) {
    local_38.ptr = AllocateEntries(this,size,true);
    Memory::
    CopyArray<JsUtil::SimpleHashedEntry<JsUtil::CharacterBuffer<char16_t>,JsUtil::CharacterBuffer<char16_t>>,JsUtil::CharacterBuffer<char16_t>,Memory::Recycler>
              (local_38.ptr,(long)(int)size,(this->entries).ptr,(long)this->count);
    DeleteEntries(this,(this->entries).ptr,this->size);
    TVar6.ptr = local_38.ptr;
    Memory::Recycler::WBSetBit((char *)pTVar1);
    (this->entries).ptr = TVar6.ptr;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
    this->size = size;
    this->modFunctionIndex = 0x4b;
  }
  else {
    local_58 = pTVar1;
    local_4c = size;
    Allocate(this,&local_48.ptr,&local_38.ptr,newBuckets._4_4_,size);
    Memory::
    CopyArray<JsUtil::SimpleHashedEntry<JsUtil::CharacterBuffer<char16_t>,JsUtil::CharacterBuffer<char16_t>>,JsUtil::CharacterBuffer<char16_t>,Memory::Recycler>
              (local_38.ptr,(long)(int)size,(this->entries).ptr,(long)this->count);
    this->modFunctionIndex = 0x4b;
    if (0 < this->count) {
      lVar10 = 0x10;
      lVar11 = 0;
      local_60 = this;
      do {
        TVar6.ptr = local_38.ptr;
        if (-2 < *(int *)((long)&((local_38.ptr)->
                                 super_DefaultHashedEntry<JsUtil::CharacterBuffer<char16_t>,_JsUtil::CharacterBuffer<char16_t>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                                 ).
                                 super_ImplicitKeyValueEntry<JsUtil::CharacterBuffer<char16_t>,_JsUtil::CharacterBuffer<char16_t>_>
                                 .
                                 super_ValueEntry<JsUtil::CharacterBuffer<char16_t>,_JsUtil::(anonymous_namespace)::ValueEntryData<JsUtil::CharacterBuffer<char16_t>_>_>
                                 .super_ValueEntryData<JsUtil::CharacterBuffer<char16_t>_>.value.
                                 string.ptr + lVar10)) {
          uVar3 = *(undefined8 *)((long)local_38.ptr + lVar10 + -0x10);
          Memory::Recycler::WBSetBit((char *)&local_70);
          local_70 = uVar3;
          Memory::RecyclerWriteBarrierManager::WriteBarrier((CharacterBuffer *)&local_70);
          this = local_60;
          local_68 = *(undefined4 *)((long)TVar6.ptr + lVar10 + -8);
          hVar7 = CharacterBuffer::operator_cast_to_unsigned_int((CharacterBuffer *)&local_70);
          uVar8 = GetBucket(hVar7 * 2 + 1,newBuckets._4_4_,this->modFunctionIndex);
          *(int *)((long)&((local_38.ptr)->
                          super_DefaultHashedEntry<JsUtil::CharacterBuffer<char16_t>,_JsUtil::CharacterBuffer<char16_t>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                          ).
                          super_ImplicitKeyValueEntry<JsUtil::CharacterBuffer<char16_t>,_JsUtil::CharacterBuffer<char16_t>_>
                          .
                          super_ValueEntry<JsUtil::CharacterBuffer<char16_t>,_JsUtil::(anonymous_namespace)::ValueEntryData<JsUtil::CharacterBuffer<char16_t>_>_>
                          .super_ValueEntryData<JsUtil::CharacterBuffer<char16_t>_>.value.string.ptr
                  + lVar10) = local_48.ptr[(int)uVar8];
          local_48.ptr[(int)uVar8] = (int)lVar11;
        }
        lVar11 = lVar11 + 1;
        lVar10 = lVar10 + 0x18;
      } while (lVar11 < this->count);
    }
    DeleteBuckets(this,(this->buckets).ptr,this->bucketCount);
    DeleteEntries(this,(this->entries).ptr,this->size);
    uVar2 = local_4c;
    pTVar1 = local_58;
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,local_4c,local_4c - this->size);
    }
    TVar5.ptr = local_48.ptr;
    Memory::Recycler::WBSetBit((char *)this);
    (this->buckets).ptr = TVar5.ptr;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
    TVar6.ptr = local_38.ptr;
    Memory::Recycler::WBSetBit((char *)pTVar1);
    (this->entries).ptr = TVar6.ptr;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
    this->bucketCount = newBuckets._4_4_;
    this->size = uVar2;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }